

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::DataBuilderCollationIterator::fetchCEs
          (DataBuilderCollationIterator *this,UnicodeString *str,int32_t start,int64_t *ces,
          int32_t cesLength)

{
  ushort uVar1;
  short sVar2;
  int32_t offset;
  CollationDataBuilder *pCVar3;
  UnicodeString *this_00;
  long *plVar4;
  long lVar5;
  int32_t iVar6;
  uint c;
  uint32_t ce32;
  char16_t *pcVar7;
  long lVar8;
  long lVar9;
  CollationData *this_01;
  UErrorCode errorCode;
  UErrorCode local_3c;
  CollationData *local_38;
  
  pCVar3 = this->builder;
  (this->builderData).ce32s = (uint32_t *)(pCVar3->ce32s).elements;
  (this->builderData).ces = (pCVar3->ce64s).elements;
  uVar1 = (pCVar3->contexts).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      pcVar7 = (pCVar3->contexts).fUnion.fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&(pCVar3->contexts).fUnion + 2);
    }
  }
  else {
    pcVar7 = (char16_t *)0x0;
  }
  local_38 = &this->builderData;
  (this->builderData).contexts = pcVar7;
  CollationIterator::reset(&this->super_CollationIterator);
  this->s = str;
  this->pos = start;
  local_3c = U_ZERO_ERROR;
  do {
    this_00 = this->s;
    sVar2 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar6 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)sVar2 >> 5;
    }
    offset = this->pos;
    if (iVar6 <= offset) {
      return cesLength;
    }
    (this->super_CollationIterator).ceBuffer.length = 0;
    (this->super_CollationIterator).cesIndex = 0;
    c = icu_63::UnicodeString::char32At(this_00,offset);
    this->pos = (this->pos - (uint)(c < 0x10000)) + 2;
    ce32 = utrie2_get32_63(this->builder->trie,c);
    this_01 = local_38;
    if (ce32 == 0xc0) {
      this_01 = this->builder->base;
      ce32 = CollationData::getCE32(this_01,c);
    }
    CollationIterator::appendCEsFromCE32
              (&this->super_CollationIterator,this_01,c,ce32,'\x01',&local_3c);
    lVar8 = (long)(this->super_CollationIterator).ceBuffer.length;
    if (0 < lVar8) {
      plVar4 = (this->super_CollationIterator).ceBuffer.buffer.ptr;
      lVar9 = 0;
      do {
        lVar5 = plVar4[lVar9];
        if (lVar5 != 0) {
          if (cesLength < 0x1f) {
            ces[cesLength] = lVar5;
          }
          cesLength = cesLength + 1;
        }
        lVar9 = lVar9 + 1;
      } while (lVar8 != lVar9);
    }
  } while (local_3c < U_ILLEGAL_ARGUMENT_ERROR);
  return cesLength;
}

Assistant:

int32_t
DataBuilderCollationIterator::fetchCEs(const UnicodeString &str, int32_t start,
                                       int64_t ces[], int32_t cesLength) {
    // Set the pointers each time, in case they changed due to reallocation.
    builderData.ce32s = reinterpret_cast<const uint32_t *>(builder.ce32s.getBuffer());
    builderData.ces = builder.ce64s.getBuffer();
    builderData.contexts = builder.contexts.getBuffer();
    // Modified copy of CollationIterator::nextCE() and CollationIterator::nextCEFromCE32().
    reset();
    s = &str;
    pos = start;
    UErrorCode errorCode = U_ZERO_ERROR;
    while(U_SUCCESS(errorCode) && pos < s->length()) {
        // No need to keep all CEs in the iterator buffer.
        clearCEs();
        UChar32 c = s->char32At(pos);
        pos += U16_LENGTH(c);
        uint32_t ce32 = utrie2_get32(builder.trie, c);
        const CollationData *d;
        if(ce32 == Collation::FALLBACK_CE32) {
            d = builder.base;
            ce32 = builder.base->getCE32(c);
        } else {
            d = &builderData;
        }
        appendCEsFromCE32(d, c, ce32, /*forward=*/ TRUE, errorCode);
        U_ASSERT(U_SUCCESS(errorCode));
        for(int32_t i = 0; i < getCEsLength(); ++i) {
            int64_t ce = getCE(i);
            if(ce != 0) {
                if(cesLength < Collation::MAX_EXPANSION_LENGTH) {
                    ces[cesLength] = ce;
                }
                ++cesLength;
            }
        }
    }
    return cesLength;
}